

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrfmt.cpp
# Opt level: O0

int32_t uprv_itou_63(UChar *buffer,int32_t capacity,uint32_t i,uint32_t radix,int32_t minwidth)

{
  UChar UVar1;
  short sVar2;
  int iVar3;
  bool local_35;
  UChar local_34;
  int local_2c;
  UChar temp;
  int32_t j;
  int digit;
  int32_t length;
  int32_t minwidth_local;
  uint32_t radix_local;
  uint32_t i_local;
  int32_t capacity_local;
  UChar *buffer_local;
  
  j = 0;
  minwidth_local = i;
  do {
    sVar2 = (short)((uint)minwidth_local % radix);
    if ((int)((uint)minwidth_local % radix) < 10) {
      local_34 = sVar2 + L'0';
    }
    else {
      local_34 = sVar2 + L'7';
    }
    iVar3 = j + 1;
    buffer[j] = local_34;
    minwidth_local = (uint)minwidth_local / radix;
    local_35 = minwidth_local != 0 && iVar3 < capacity;
    j = iVar3;
  } while (local_35);
  while (j < minwidth) {
    buffer[j] = L'0';
    j = j + 1;
  }
  if (j < capacity) {
    buffer[j] = L'\0';
  }
  for (local_2c = 0; local_2c < j / 2; local_2c = local_2c + 1) {
    UVar1 = buffer[(j + -1) - local_2c];
    buffer[(j + -1) - local_2c] = buffer[local_2c];
    buffer[local_2c] = UVar1;
  }
  return j;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uprv_itou (UChar * buffer, int32_t capacity,
           uint32_t i, uint32_t radix, int32_t minwidth)
{
    int32_t length = 0;
    int digit;
    int32_t j;
    UChar temp;

    do{
        digit = (int)(i % radix);
        buffer[length++]=(UChar)(digit<=9?(0x0030+digit):(0x0030+digit+7));
        i=i/radix;
    } while(i && length<capacity);

    while (length < minwidth){
        buffer[length++] = (UChar) 0x0030;/*zero padding */
    }
    /* null terminate the buffer */
    if(length<capacity){
        buffer[length] = (UChar) 0x0000;
    }

    /* Reverses the string */
    for (j = 0; j < (length / 2); j++){
        temp = buffer[(length-1) - j];
        buffer[(length-1) - j] = buffer[j];
        buffer[j] = temp;
    }
    return length;
}